

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# renderer.cpp
# Opt level: O3

void __thiscall
GeometryPass::execute
          (GeometryPass *this,vector<Object,_std::allocator<Object>_> *objects,mat4 clip_from_world,
          TextureLoader *loader)

{
  ulong uVar1;
  Block *pBVar2;
  GpuCtx *pGVar3;
  pointer pOVar4;
  ulong uVar5;
  undefined8 uVar6;
  uint uVar7;
  ExplicitProducer *pEVar8;
  ExplicitProducer *extraout_RAX;
  GpuCtxWrapper *pGVar9;
  ExplicitProducer *extraout_RAX_00;
  ImageTexture *pIVar10;
  ExplicitProducer *extraout_RAX_01;
  ExplicitProducer *extraout_RAX_02;
  ExplicitProducer *pEVar11;
  uint uVar12;
  Shader *this_00;
  pointer __src;
  ulong uVar13;
  Object obj;
  string local_200;
  string local_1e0;
  string local_1c0;
  string local_1a0;
  string local_180;
  Transform local_160;
  uint local_f8;
  uint local_ec;
  TexID local_e8;
  TexID local_e0;
  TexID local_d8;
  mat4 local_70;
  
  pEVar8 = tracy::GetToken();
  uVar1 = (pEVar8->super_ProducerBase).tailIndex.super___atomic_base<unsigned_long>._M_i;
  pEVar11 = pEVar8;
  if ((uVar1 & 0xffff) == 0) {
    tracy::moodycamel::
    ConcurrentQueue<tracy::QueueItem,_tracy::moodycamel::ConcurrentQueueDefaultTraits>::
    ExplicitProducer::enqueue_begin_alloc(pEVar8,uVar1);
    pEVar11 = extraout_RAX;
  }
  pBVar2 = (pEVar8->super_ProducerBase).tailBlock;
  uVar13 = (ulong)(uint)((int)(uVar1 & 0xffff) << 5);
  (pBVar2->field_0).elements[uVar13] = '\x0f';
  uVar5 = rdtsc();
  *(ulong *)((long)&pBVar2->field_0 + uVar13 + 1) =
       (uVar5 & 0xffffffff00000000) + CONCAT44((int)((ulong)pEVar11 >> 0x20),(int)uVar5);
  *(SourceLocationData **)((long)&pBVar2->field_0 + uVar13 + 9) =
       &execute::__tracy_source_location183;
  (pEVar8->super_ProducerBase).tailIndex.super___atomic_base<unsigned_long>._M_i = uVar1 + 1;
  pGVar9 = tracy::GetGpuCtx();
  pGVar3 = pGVar9->ptr;
  uVar7 = pGVar3->m_head;
  uVar12 = uVar7 + 1 & 0xffff;
  pGVar3->m_head = uVar12;
  uVar6 = gl3wProcs.ptr[0x1b1];
  if (uVar12 != pGVar3->m_tail) {
    pGVar9 = tracy::GetGpuCtx();
    (*(code *)uVar6)((ulong)pGVar9->ptr->m_query[uVar7],0x8e28);
    pEVar8 = tracy::GetToken();
    uVar1 = (pEVar8->super_ProducerBase).tailIndex.super___atomic_base<unsigned_long>._M_i;
    pEVar11 = pEVar8;
    if ((uVar1 & 0xffff) == 0) {
      tracy::moodycamel::
      ConcurrentQueue<tracy::QueueItem,_tracy::moodycamel::ConcurrentQueueDefaultTraits>::
      ExplicitProducer::enqueue_begin_alloc(pEVar8,uVar1);
      pEVar11 = extraout_RAX_00;
    }
    pBVar2 = (pEVar8->super_ProducerBase).tailBlock;
    uVar13 = (ulong)(uint)((int)(uVar1 & 0xffff) << 5);
    (pBVar2->field_0).elements[uVar13] = '!';
    uVar5 = rdtsc();
    *(ulong *)((long)&pBVar2->field_0 + uVar13 + 1) =
         (uVar5 & 0xffffffff00000000) + CONCAT44((int)((ulong)pEVar11 >> 0x20),(int)uVar5);
    *(undefined4 *)((long)&pBVar2->field_0 + uVar13 + 9) = 0;
    *(short *)((long)&pBVar2->field_0 + uVar13 + 0xd) = (short)uVar7;
    pGVar9 = tracy::GetGpuCtx();
    (pBVar2->field_0).elements[uVar13 + 0xf] = pGVar9->ptr->m_context;
    *(SourceLocationData **)((long)&pBVar2->field_0 + uVar13 + 0x10) =
         &execute::__tracy_gpu_source_location184;
    (pEVar8->super_ProducerBase).tailIndex.super___atomic_base<unsigned_long>._M_i = uVar1 + 1;
    (*gl3wProcs.ptr[0x1b0])(0x824a,0,0xffffffff,"Geometry pass");
    (*gl3wProcs.ptr[0x179])();
    (*gl3wProcs.ptr[0x96])(0xb71);
    (*gl3wProcs.ptr[0xf])(0x8d40,(ulong)this->fbo);
    (*gl3wProcs.ptr[0x35])(0,0,0,0);
    (*gl3wProcs.ptr[0x2e])(0x4100);
    uVar6 = gl3wProcs.ptr[0x22f];
    this_00 = &this->program;
    uVar7 = Shader::id(this_00);
    (*(code *)uVar6)((ulong)uVar7);
    uVar6 = gl3wProcs.ptr[0x227];
    local_180._M_dataplus._M_p = (pointer)&local_180.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_180,"viewproj","");
    uVar7 = Shader::getLoc(this_00,&local_180);
    (*(code *)uVar6)((ulong)uVar7,1,0,&clip_from_world);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_180._M_dataplus._M_p != &local_180.field_2) {
      operator_delete(local_180._M_dataplus._M_p,local_180.field_2._M_allocated_capacity + 1);
    }
    uVar6 = gl3wProcs.ptr[0x1fd];
    local_1a0._M_dataplus._M_p = (pointer)&local_1a0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a0,"albedoMap","");
    uVar7 = Shader::getLoc(this_00,&local_1a0);
    (*(code *)uVar6)((ulong)uVar7,0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
      operator_delete(local_1a0._M_dataplus._M_p,local_1a0.field_2._M_allocated_capacity + 1);
    }
    uVar6 = gl3wProcs.ptr[0x1fd];
    local_1c0._M_dataplus._M_p = (pointer)&local_1c0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1c0,"roughnessMetallicMap","");
    uVar7 = Shader::getLoc(this_00,&local_1c0);
    (*(code *)uVar6)((ulong)uVar7,1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
      operator_delete(local_1c0._M_dataplus._M_p,local_1c0.field_2._M_allocated_capacity + 1);
    }
    uVar6 = gl3wProcs.ptr[0x1fd];
    local_1e0._M_dataplus._M_p = (pointer)&local_1e0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1e0,"normalMap","");
    uVar7 = Shader::getLoc(this_00,&local_1e0);
    (*(code *)uVar6)((ulong)uVar7,2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
      operator_delete(local_1e0._M_dataplus._M_p,local_1e0.field_2._M_allocated_capacity + 1);
    }
    __src = (objects->super__Vector_base<Object,_std::allocator<Object>_>)._M_impl.
            super__Vector_impl_data._M_start;
    pOVar4 = (objects->super__Vector_base<Object,_std::allocator<Object>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    if (__src != pOVar4) {
      do {
        memcpy(&local_160,__src,0xf0);
        (*gl3wProcs.ptr[1])(0x84c0);
        uVar6 = gl3wProcs.ptr[0x16];
        pIVar10 = TextureLoader::get(loader,local_e8);
        uVar7 = ImageTexture::id(pIVar10);
        (*(code *)uVar6)(0xde1,(ulong)uVar7);
        (*gl3wProcs.ptr[1])(0x84c1);
        uVar6 = gl3wProcs.ptr[0x16];
        pIVar10 = TextureLoader::get(loader,local_e0);
        uVar7 = ImageTexture::id(pIVar10);
        (*(code *)uVar6)(0xde1,(ulong)uVar7);
        (*gl3wProcs.ptr[1])(0x84c2);
        uVar6 = gl3wProcs.ptr[0x16];
        pIVar10 = TextureLoader::get(loader,local_d8);
        uVar7 = ImageTexture::id(pIVar10);
        (*(code *)uVar6)(0xde1,(ulong)uVar7);
        (*gl3wProcs.ptr[0x1a])((ulong)local_f8);
        uVar6 = gl3wProcs.ptr[0x227];
        local_200._M_dataplus._M_p = (pointer)&local_200.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_200,"model","");
        uVar7 = Shader::getLoc(this_00,&local_200);
        Transform::getMatrix(&local_70,&local_160);
        (*(code *)uVar6)((ulong)uVar7,1,0,&local_70);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_200._M_dataplus._M_p != &local_200.field_2) {
          operator_delete(local_200._M_dataplus._M_p,local_200.field_2._M_allocated_capacity + 1);
        }
        (*gl3wProcs.ptr[0x89])(4,(ulong)local_ec,0x1405,0);
        __src = __src + 1;
      } while (__src != pOVar4);
    }
    pGVar9 = tracy::GetGpuCtx();
    pGVar3 = pGVar9->ptr;
    uVar7 = pGVar3->m_head;
    uVar12 = uVar7 + 1 & 0xffff;
    pGVar3->m_head = uVar12;
    uVar6 = gl3wProcs.ptr[0x1b1];
    if (uVar12 != pGVar3->m_tail) {
      pGVar9 = tracy::GetGpuCtx();
      (*(code *)uVar6)((ulong)pGVar9->ptr->m_query[uVar7],0x8e28);
      pEVar8 = tracy::GetToken();
      uVar1 = (pEVar8->super_ProducerBase).tailIndex.super___atomic_base<unsigned_long>._M_i;
      pEVar11 = pEVar8;
      if ((uVar1 & 0xffff) == 0) {
        tracy::moodycamel::
        ConcurrentQueue<tracy::QueueItem,_tracy::moodycamel::ConcurrentQueueDefaultTraits>::
        ExplicitProducer::enqueue_begin_alloc(pEVar8,uVar1);
        pEVar11 = extraout_RAX_01;
      }
      pBVar2 = (pEVar8->super_ProducerBase).tailBlock;
      uVar13 = (ulong)(uint)((int)(uVar1 & 0xffff) << 5);
      (pBVar2->field_0).elements[uVar13] = '%';
      uVar5 = rdtsc();
      *(ulong *)((long)&pBVar2->field_0 + uVar13 + 1) =
           (uVar5 & 0xffffffff00000000) + CONCAT44((int)((ulong)pEVar11 >> 0x20),(int)uVar5);
      *(undefined4 *)((long)&pBVar2->field_0 + uVar13 + 9) = 0;
      *(short *)((long)&pBVar2->field_0 + uVar13 + 0xd) = (short)uVar7;
      pGVar9 = tracy::GetGpuCtx();
      (pBVar2->field_0).elements[uVar13 + 0xf] = pGVar9->ptr->m_context;
      (pEVar8->super_ProducerBase).tailIndex.super___atomic_base<unsigned_long>._M_i = uVar1 + 1;
      pEVar8 = tracy::GetToken();
      uVar1 = (pEVar8->super_ProducerBase).tailIndex.super___atomic_base<unsigned_long>._M_i;
      pEVar11 = pEVar8;
      if ((uVar1 & 0xffff) == 0) {
        tracy::moodycamel::
        ConcurrentQueue<tracy::QueueItem,_tracy::moodycamel::ConcurrentQueueDefaultTraits>::
        ExplicitProducer::enqueue_begin_alloc(pEVar8,uVar1);
        pEVar11 = extraout_RAX_02;
      }
      pBVar2 = (pEVar8->super_ProducerBase).tailBlock;
      uVar13 = (ulong)(uint)((int)(uVar1 & 0xffff) << 5);
      (pBVar2->field_0).elements[uVar13] = '\x11';
      uVar5 = rdtsc();
      *(ulong *)((long)&pBVar2->field_0 + uVar13 + 1) =
           (uVar5 & 0xffffffff00000000) + CONCAT44((int)((ulong)pEVar11 >> 0x20),(int)uVar5);
      (pEVar8->super_ProducerBase).tailIndex.super___atomic_base<unsigned_long>._M_i = uVar1 + 1;
      return;
    }
  }
  __assert_fail("m_head != m_tail",
                "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/tracy/TracyOpenGL.hpp"
                ,0xb4,"unsigned int tracy::GpuCtx::NextQueryId()");
}

Assistant:

void GeometryPass::execute(const std::vector<Object>& objects, glm::mat4 clip_from_world, TextureLoader* loader)
{
    ZoneScopedN("Geometry Pass");
    TracyGpuZone("Geometry pass");
    GLScopedDebugGroup("Geometry pass");

    // === GEOMETRY PASS ===
    glEnable(GL_DEPTH_TEST);
    glBindFramebuffer(GL_FRAMEBUFFER, fbo);
    glClearColor(0.0, 0.0, 0.0, 0.0);
    glClear(GL_COLOR_BUFFER_BIT | GL_DEPTH_BUFFER_BIT);

    glUseProgram(program.id());
    glUniformMatrix4fv(program.getLoc("viewproj"), 1, GL_FALSE, glm::value_ptr(clip_from_world));
    glUniform1i(program.getLoc("albedoMap"), 0);
    glUniform1i(program.getLoc("roughnessMetallicMap"), 1);
    glUniform1i(program.getLoc("normalMap"), 2);

    for (auto obj : objects) {
        glActiveTexture(GL_TEXTURE0 + 0);
        glBindTexture(GL_TEXTURE_2D, loader->get(obj.material.albedoMap)->id());
        glActiveTexture(GL_TEXTURE0 + 1);
        glBindTexture(GL_TEXTURE_2D, loader->get(obj.material.roughnessMetallicMap)->id());
        glActiveTexture(GL_TEXTURE0 + 2);
        glBindTexture(GL_TEXTURE_2D, loader->get(obj.material.normalMap)->id());

        glBindVertexArray(obj.mesh.vao);
        glUniformMatrix4fv(program.getLoc("model"), 1, GL_FALSE, glm::value_ptr(obj.transform.getMatrix()));

        glDrawElements(GL_TRIANGLES, obj.mesh.numIndices, GL_UNSIGNED_INT, (void*)0);
    }
}